

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O2

Bigint * i2b(int i)

{
  Bigint *pBVar1;
  
  pBVar1 = Balloc(1);
  if (pBVar1 != (Bigint *)0x0) {
    pBVar1->x[0] = i;
    pBVar1->wds = 1;
  }
  return pBVar1;
}

Assistant:

static Bigint *
i2b(int i)
{
    Bigint *b;

    b = Balloc(1);
    if (b == NULL)
        return NULL;
    b->x[0] = i;
    b->wds = 1;
    return b;
}